

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TtCofactorPermConfig(word *pTruth,int i,int nWords,int fSwapOnly,int fNaive)

{
  ulong *puVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  int iVar6;
  int iVar7;
  uint *pLimitU;
  byte bVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  uint *pTruthU;
  uint uVar12;
  word *pwVar13;
  word *pwVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  
  if (nWords == 1) {
    iVar6 = Abc_Tt6CofactorPermNaive(pTruth,i,fSwapOnly);
    return iVar6;
  }
  if (fNaive != 0) {
    iVar6 = Abc_TtCofactorPermNaive(pTruth,i,nWords,fSwapOnly);
    return iVar6;
  }
  bVar8 = (byte)i;
  if (fSwapOnly != 0) {
    iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
    if (-1 < iVar6) {
      return 0;
    }
    if (i < 5) {
      if (0 < nWords) {
        uVar11 = s_PMasks[i][0];
        uVar16 = s_PMasks[i][1];
        uVar3 = s_PMasks[i][2];
        uVar15 = 0;
        do {
          uVar4 = pTruth[uVar15];
          bVar9 = (byte)(1 << (bVar8 & 0x1f));
          pTruth[uVar15] =
               (uVar4 & uVar3) >> (bVar9 & 0x3f) |
               (uVar4 & uVar16) << (bVar9 & 0x3f) | uVar4 & uVar11;
          uVar15 = uVar15 + 1;
        } while ((uint)nWords != uVar15);
        return 4;
      }
      return 4;
    }
    pwVar2 = pTruth + nWords;
    if (i != 5) {
      if (0 < nWords) {
        uVar11 = (ulong)(uint)(1 << (bVar8 - 6 & 0x1f));
        if (i < 7) {
          uVar11 = 1;
        }
        iVar6 = (int)uVar11;
        iVar10 = iVar6 * 4;
        pwVar13 = pTruth + (uint)(iVar6 * 2);
        pwVar14 = pTruth + uVar11;
        do {
          if (0 < iVar6) {
            uVar16 = 0;
            do {
              wVar5 = pwVar14[uVar16];
              pwVar14[uVar16] = pwVar13[uVar16];
              pwVar13[uVar16] = wVar5;
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
          }
          pTruth = pTruth + iVar10;
          pwVar13 = pwVar13 + iVar10;
          pwVar14 = pwVar14 + iVar10;
        } while (pTruth < pwVar2);
        return 4;
      }
      return 4;
    }
    if (0 < nWords) {
      do {
        puVar1 = (ulong *)((long)pTruth + 4);
        *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
        pTruth = pTruth + 2;
      } while (pTruth < pwVar2);
      return 4;
    }
    return 4;
  }
  iVar10 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,1);
  iVar7 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,2,3);
  iVar6 = i;
  if (iVar7 < 0) {
    if (iVar10 < 0) {
      iVar10 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
      if (iVar10 == 0) {
        uVar12 = 1;
        uVar17 = 3;
        iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
        Abc_TtFlip(pTruth,nWords,i);
        goto joined_r0x004fc94e;
      }
      uVar17 = 1;
      if (iVar10 == -1) goto LAB_004fc8fc;
    }
    else {
      uVar17 = 1;
      iVar7 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
      if (iVar7 < 1) {
        if (iVar7 == 0) {
LAB_004fc8fc:
          Abc_TtFlip(pTruth,nWords,i);
          uVar17 = 3;
          iVar6 = i + 1;
        }
        else {
          Abc_TtFlip(pTruth,nWords,i + 1);
          uVar12 = 2;
          if (iVar10 != 0) goto LAB_004fc962;
          uVar17 = 3;
        }
      }
    }
  }
  else if (iVar10 < 0) {
    uVar12 = 0;
    iVar10 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,3);
    if (iVar10 < 0) goto LAB_004fc8fc;
    if (iVar7 != 0) goto LAB_004fc962;
    uVar17 = 1;
  }
  else {
    iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
    if (iVar6 < 0) {
      uVar17 = 2;
      iVar6 = i + 1;
    }
    else {
      uVar12 = 0;
      if (iVar6 != 0) goto LAB_004fc962;
      uVar12 = 0;
      uVar17 = 2;
      iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
joined_r0x004fc94e:
      if (-1 < iVar6) goto LAB_004fc962;
      iVar6 = i + 1;
    }
  }
  Abc_TtFlip(pTruth,nWords,iVar6);
  uVar12 = uVar17;
LAB_004fc962:
  iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
  if (iVar6 < 0) {
    if (i < 5) {
      if (0 < nWords) {
        uVar11 = s_PMasks[i][0];
        uVar16 = s_PMasks[i][1];
        uVar3 = s_PMasks[i][2];
        uVar15 = 0;
        do {
          uVar4 = pTruth[uVar15];
          bVar9 = (byte)(1 << (bVar8 & 0x1f));
          pTruth[uVar15] =
               (uVar4 & uVar3) >> (bVar9 & 0x3f) |
               (uVar4 & uVar16) << (bVar9 & 0x3f) | uVar4 & uVar11;
          uVar15 = uVar15 + 1;
        } while ((uint)nWords != uVar15);
      }
    }
    else {
      pwVar2 = pTruth + nWords;
      if (i == 5) {
        if (0 < nWords) {
          do {
            puVar1 = (ulong *)((long)pTruth + 4);
            *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
            pTruth = pTruth + 2;
          } while (pTruth < pwVar2);
        }
      }
      else if (0 < nWords) {
        uVar11 = (ulong)(uint)(1 << (bVar8 - 6 & 0x1f));
        if (i < 7) {
          uVar11 = 1;
        }
        iVar6 = (int)uVar11;
        iVar10 = iVar6 * 4;
        pwVar13 = pTruth + (uint)(iVar6 * 2);
        pwVar14 = pTruth + uVar11;
        do {
          if (0 < iVar6) {
            uVar16 = 0;
            do {
              wVar5 = pwVar14[uVar16];
              pwVar14[uVar16] = pwVar13[uVar16];
              pwVar13[uVar16] = wVar5;
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
          }
          pTruth = pTruth + iVar10;
          pwVar13 = pwVar13 + iVar10;
          pwVar14 = pwVar14 + iVar10;
        } while (pTruth < pwVar2);
      }
    }
    uVar12 = uVar12 | 4;
  }
  return uVar12;
}

Assistant:

int Abc_TtCofactorPermConfig( word * pTruth, int i, int nWords, int fSwapOnly, int fNaive )
{
    if ( nWords == 1 )
        return Abc_Tt6CofactorPermNaive( pTruth, i, fSwapOnly );
    if ( fNaive )
        return Abc_TtCofactorPermNaive( pTruth, i, nWords, fSwapOnly );
    if ( fSwapOnly )
    {
        if ( Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 ) < 0 ) // Cof1 < Cof2
        {
            Abc_TtSwapAdjacent( pTruth, nWords, i );
            return 4;
        }
        return 0;
    }
    {  
        int fComp01, fComp02, fComp03, fComp12, fComp13, fComp23, Config = 0;
        fComp01 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 1 );
        fComp23 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 2, 3 );
        if ( fComp23 >= 0 ) // Cof2 >= Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                if ( fComp13 < 0 ) // Cof1 < Cof3 
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                else if ( fComp13 == 0 ) // Cof1 == Cof3 
                {
                    fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                    if ( fComp02 < 0 )
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                }
                // else   Cof1 > Cof3 -- do nothing
            }
            else // Cof0 < Cof1
            {
                fComp03 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 3 );
                if ( fComp03 < 0 ) // Cof0 < Cof3
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else //  Cof0 >= Cof3
                {
                    if ( fComp23 == 0 ) // can flip Cof0 and Cof1
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                }
            }
        }
        else // Cof2 < Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
                if ( fComp12 > 0 ) // Cof1 > Cof2 
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                else if ( fComp12 == 0 ) // Cof1 == Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else // Cof1 < Cof2
                {
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                    if ( fComp01 == 0 )
                        Abc_TtFlip( pTruth, nWords, i ), Config ^= 1;
                }
            }
            else // Cof0 < Cof1
            {
                fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                if ( fComp02 == -1 ) // Cof0 < Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else if ( fComp02 == 0 ) // Cof0 == Cof2
                {
                    fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                    if ( fComp13 >= 0 ) // Cof1 >= Cof3 
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                    else // Cof1 < Cof3 
                    {
                        Abc_TtFlip( pTruth, nWords, i );
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                    }
                }
                else // Cof0 > Cof2
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
            }
        }
        // perform final swap if needed
        fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
        if ( fComp12 < 0 ) // Cof1 < Cof2
            Abc_TtSwapAdjacent( pTruth, nWords, i ), Config ^= 4;
        return Config;
    }
}